

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# i_specialpaths.cpp
# Opt level: O1

FString GetUserFile(char *file)

{
  undefined8 uVar1;
  int iVar2;
  int *piVar3;
  char *pcVar4;
  char *in_RSI;
  FString oldpath;
  FString configPath;
  stat extrainfo;
  stat info;
  FString local_148;
  FString local_140;
  stat local_138;
  stat local_a8;
  
  file[0] = -0x44;
  file[1] = '}';
  file[2] = 'r';
  file[3] = '\0';
  file[4] = '\0';
  file[5] = '\0';
  file[6] = '\0';
  file[7] = '\0';
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  NicePath((char *)&local_138);
  FString::operator=((FString *)file,(FString *)&local_138);
  FString::~FString((FString *)&local_138);
  iVar2 = stat(*(char **)file,&local_a8);
  if (iVar2 != -1) {
    if ((local_a8.st_mode & 0xf000) != 0x4000) {
      I_FatalError("%s must be a directory",*(undefined8 *)file);
    }
    goto LAB_002ccb3e;
  }
  NicePath((char *)&local_140);
  iVar2 = stat(local_140.Chars,&local_138);
  if (iVar2 == -1) {
    iVar2 = mkdir(local_140.Chars,0x1c0);
    if (iVar2 == -1) {
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      I_FatalError("Failed to create ~/.config directory:\n%s",pcVar4);
    }
  }
  else if ((local_138.st_mode & 0xf000) != 0x4000) {
    I_FatalError("~/.config must be a directory");
  }
  NicePath((char *)&local_148);
  iVar2 = stat(local_148.Chars,&local_138);
  if (iVar2 == -1) {
LAB_002ccaf7:
    iVar2 = mkdir(*(char **)file,0x1c0);
    if (iVar2 == -1) {
      uVar1 = *(undefined8 *)file;
      piVar3 = __errno_location();
      pcVar4 = strerror(*piVar3);
      I_FatalError("Failed to create %s directory:\n%s",uVar1,pcVar4);
    }
  }
  else {
    iVar2 = rename(local_148.Chars,*(char **)file);
    if (iVar2 == -1) {
      I_Error("Failed to move old zdoom directory (%s) to new location (%s).",local_148.Chars,
              *(undefined8 *)file);
      goto LAB_002ccaf7;
    }
  }
  FString::~FString(&local_148);
  FString::~FString(&local_140);
LAB_002ccb3e:
  FString::operator+=((FString *)file,in_RSI);
  return (FString)file;
}

Assistant:

FString GetUserFile (const char *file)
{
	FString path;
	struct stat info;

	path = NicePath("~/" GAME_DIR "/");

	if (stat (path, &info) == -1)
	{
		struct stat extrainfo;

		// Sanity check for ~/.config
		FString configPath = NicePath("~/.config/");
		if (stat (configPath, &extrainfo) == -1)
		{
			if (mkdir (configPath, S_IRUSR | S_IWUSR | S_IXUSR) == -1)
			{
				I_FatalError ("Failed to create ~/.config directory:\n%s", strerror(errno));
			}
		}
		else if (!S_ISDIR(extrainfo.st_mode))
		{
			I_FatalError ("~/.config must be a directory");
		}

		// This can be removed after a release or two
		// Transfer the old zdoom directory to the new location
		bool moved = false;
		FString oldpath = NicePath("~/." GAMENAMELOWERCASE "/");
		if (stat (oldpath, &extrainfo) != -1)
		{
			if (rename(oldpath, path) == -1)
			{
				I_Error ("Failed to move old " GAMENAMELOWERCASE " directory (%s) to new location (%s).",
					oldpath.GetChars(), path.GetChars());
			}
			else
				moved = true;
		}

		if (!moved && mkdir (path, S_IRUSR | S_IWUSR | S_IXUSR) == -1)
		{
			I_FatalError ("Failed to create %s directory:\n%s",
				path.GetChars(), strerror (errno));
		}
	}
	else
	{
		if (!S_ISDIR(info.st_mode))
		{
			I_FatalError ("%s must be a directory", path.GetChars());
		}
	}
	path += file;
	return path;
}